

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::RsCaseSyntax::setChild(RsCaseSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004d14c8 + *(int *)(&DAT_004d14c8 + index * 4)))();
  return;
}

Assistant:

void RsCaseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: keyword = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: closeParen = child.token(); return;
        case 4: items = child.node()->as<SyntaxList<RsCaseItemSyntax>>(); return;
        case 5: endcase = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}